

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

bool __thiscall
basisu::tree_vector_quant<basisu::vec<16U,_float>_>::refine_split
          (tree_vector_quant<basisu::vec<16U,_float>_> *this,tsvq_node *node,
          vec<16U,_float> *l_child,uint64_t *l_weight,float *l_var,vector<unsigned_int> *l_children,
          vec<16U,_float> *r_child,uint64_t *r_weight,float *r_var,vector<unsigned_int> *r_children)

{
  uint uVar1;
  double dVar2;
  bool bVar3;
  uint32_t uVar4;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar5;
  ulong *in_RCX;
  vec<16U,_float> *in_RDX;
  long in_RSI;
  float *in_R8;
  float fVar6;
  vec<16U,_float> *in_stack_00000008;
  ulong *in_stack_00000010;
  float *in_stack_00000018;
  float cVarianceDeltaThresh;
  float cGiveupVariance;
  float total_var;
  uint64_t weight_1;
  vec<16U,_float> *v_1;
  uint32_t i_1;
  vec<16U,_float> firstVec;
  double right_dist2;
  double left_dist2;
  uint64_t weight;
  vec<16U,_float> *v;
  uint32_t i;
  double r_ttsum;
  double l_ttsum;
  vec<16U,_float> new_r_child;
  vec<16U,_float> new_l_child;
  uint32_t iter;
  uint32_t cMaxIters;
  float prev_total_variance;
  float in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  float in_stack_fffffffffffffc60;
  float in_stack_fffffffffffffc64;
  vec<16U,_float> *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  float local_384;
  size_t in_stack_fffffffffffffc88;
  vec<16U,_float> *this_00;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  float local_368;
  float local_34c;
  float local_31c;
  float local_2dc;
  float local_2ac;
  vec<16U,_float> local_258;
  vec<16U,_float> local_218;
  unsigned_long local_1d8;
  pair<basisu::vec<16U,_float>,_unsigned_long> *local_1d0;
  uint local_1c4;
  vec<16U,_float> local_1c0;
  vec<16U,_float> local_180;
  vec<16U,_float> local_140;
  double local_100;
  double local_f8;
  unsigned_long local_f0;
  pair<basisu::vec<16U,_float>,_unsigned_long> *local_e8;
  uint local_dc;
  vec<16U,_float> *local_d8;
  double local_d0;
  vec<16U,_float> local_c4;
  vec<16U,_float> local_84;
  uint local_44;
  undefined4 local_40;
  float local_3c;
  float *local_30;
  ulong *local_28;
  vec<16U,_float> *local_20;
  long local_18;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  vector<unsigned_int>::size((vector<unsigned_int> *)(in_RSI + 0x58));
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc88);
  vector<unsigned_int>::size((vector<unsigned_int> *)(local_18 + 0x58));
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc88);
  local_3c = 1e+10;
  local_40 = 6;
  local_44 = 0;
  while( true ) {
    if (5 < local_44) {
      return true;
    }
    vector<unsigned_int>::resize
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
               ,(size_t)in_stack_fffffffffffffc68,SUB41((uint)in_stack_fffffffffffffc64 >> 0x18,0));
    vector<unsigned_int>::resize
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
               ,(size_t)in_stack_fffffffffffffc68,SUB41((uint)in_stack_fffffffffffffc64 >> 0x18,0));
    vec<16U,_float>::vec
              ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               (eZero)in_stack_fffffffffffffc5c);
    vec<16U,_float>::vec
              ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               (eZero)in_stack_fffffffffffffc5c);
    local_d0 = 0.0;
    local_d8 = (vec<16U,_float> *)0x0;
    *local_28 = 0;
    *in_stack_00000010 = 0;
    for (local_dc = 0; uVar1 = local_dc,
        uVar4 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_18 + 0x58)), uVar1 < uVar4
        ; local_dc = local_dc + 1) {
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      local_e8 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                           ((vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                            CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      ppVar5 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                         ((vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      local_f0 = ppVar5->second;
      local_f8 = vec<16U,_float>::squared_distance_d(local_20,&local_e8->first);
      local_100 = vec<16U,_float>::squared_distance_d(in_stack_00000008,&local_e8->first);
      if (local_f8 < local_100) {
        operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
        vec<16U,_float>::operator+=(&local_84,&local_180);
        *local_28 = *local_28 + local_f0;
        local_2dc = (float)local_f0;
        fVar6 = vec<16U,_float>::dot
                          ((vec<16U,_float> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           (vec<16U,_float> *)
                           CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_d0 = (double)(local_2dc * fVar6) + local_d0;
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   (uint *)in_stack_fffffffffffffc68);
      }
      else {
        operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
        vec<16U,_float>::operator+=(&local_c4,&local_140);
        *in_stack_00000010 = *in_stack_00000010 + local_f0;
        local_2ac = (float)local_f0;
        fVar6 = vec<16U,_float>::dot
                          ((vec<16U,_float> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           (vec<16U,_float> *)
                           CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_d8 = (vec<16U,_float> *)((double)(local_2ac * fVar6) + (double)local_d8);
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   (uint *)in_stack_fffffffffffffc68);
      }
    }
    if ((*local_28 == 0) || (*in_stack_00000010 == 0)) {
      vector<unsigned_int>::resize
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (size_t)in_stack_fffffffffffffc68,SUB41((uint)in_stack_fffffffffffffc64 >> 0x18,0))
      ;
      vec<16U,_float>::set(&local_84,0.0);
      local_d0 = 0.0;
      *local_28 = 0;
      vector<unsigned_int>::resize
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (size_t)in_stack_fffffffffffffc68,SUB41((uint)in_stack_fffffffffffffc64 >> 0x18,0))
      ;
      vec<16U,_float>::set(&local_c4,0.0);
      local_d8 = (vec<16U,_float> *)0x0;
      *in_stack_00000010 = 0;
      vec<16U,_float>::vec(&local_1c0);
      for (local_1c4 = 0; uVar1 = local_1c4,
          uVar4 = vector<unsigned_int>::size((vector<unsigned_int> *)(local_18 + 0x58)),
          uVar1 < uVar4; local_1c4 = local_1c4 + 1) {
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_1d0 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                              ((vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        vector<unsigned_int>::operator[]
                  ((vector<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        ppVar5 = vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_>::operator[]
                           ((vector<std::pair<basisu::vec<16U,_float>,_unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                            CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_1d8 = ppVar5->second;
        if ((local_1c4 == 0) ||
           (bVar3 = vec<16U,_float>::operator==(&local_1d0->first,&local_1c0), bVar3)) {
          vec<16U,_float>::operator=(&local_1c0,&local_1d0->first);
          operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
          vec<16U,_float>::operator+=(&local_c4,&local_218);
          *in_stack_00000010 = *in_stack_00000010 + local_1d8;
          local_31c = (float)local_1d8;
          fVar6 = vec<16U,_float>::dot
                            ((vec<16U,_float> *)
                             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                             (vec<16U,_float> *)
                             CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          local_d8 = (vec<16U,_float> *)((double)(local_31c * fVar6) + (double)local_d8);
          vector<unsigned_int>::operator[]
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     (uint *)in_stack_fffffffffffffc68);
        }
        else {
          operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
          vec<16U,_float>::operator+=(&local_84,&local_258);
          *local_28 = *local_28 + local_1d8;
          local_34c = (float)local_1d8;
          fVar6 = vec<16U,_float>::dot
                            ((vec<16U,_float> *)
                             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                             (vec<16U,_float> *)
                             CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          local_d0 = (double)(local_34c * fVar6) + local_d0;
          vector<unsigned_int>::operator[]
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     (uint *)in_stack_fffffffffffffc68);
        }
      }
      if ((*local_28 == 0) || (*in_stack_00000010 == 0)) {
        return false;
      }
    }
    dVar2 = local_d0;
    this_00 = &local_84;
    fVar6 = vec<16U,_float>::dot
                      ((vec<16U,_float> *)
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       (vec<16U,_float> *)
                       CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    local_368 = (float)*local_28;
    *local_30 = (float)(dVar2 - (double)(fVar6 / local_368));
    in_stack_fffffffffffffc68 = local_d8;
    in_stack_fffffffffffffc74 =
         vec<16U,_float>::dot
                   ((vec<16U,_float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                    ,(vec<16U,_float> *)
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    local_384 = (float)*in_stack_00000010;
    *in_stack_00000018 =
         (float)((double)in_stack_fffffffffffffc68 - (double)(in_stack_fffffffffffffc74 / local_384)
                );
    in_stack_fffffffffffffc60 = (float)(long)*local_28;
    in_stack_fffffffffffffc64 = (float)*local_28;
    vec<16U,_float>::operator*=(this_00,1.0 / in_stack_fffffffffffffc64);
    in_stack_fffffffffffffc58 = (float)(long)*in_stack_00000010;
    in_stack_fffffffffffffc5c = (float)*in_stack_00000010;
    vec<16U,_float>::operator*=(&local_c4,1.0 / in_stack_fffffffffffffc5c);
    vec<16U,_float>::operator=(local_20,&local_84);
    vec<16U,_float>::operator=(in_stack_00000008,&local_c4);
    fVar6 = *local_30 + *in_stack_00000018;
    if (fVar6 < 1e-05) {
      return true;
    }
    if ((local_3c - fVar6) / fVar6 < 0.00125) break;
    local_44 = local_44 + 1;
    local_3c = fVar6;
  }
  return true;
}

Assistant:

bool refine_split(const tsvq_node &node,
			TrainingVectorType &l_child, uint64_t &l_weight, float &l_var, basisu::vector<uint32_t> &l_children,
			TrainingVectorType &r_child, uint64_t &r_weight, float &r_var, basisu::vector<uint32_t> &r_children) const
		{
			l_children.reserve(node.m_training_vecs.size());
			r_children.reserve(node.m_training_vecs.size());

			float prev_total_variance = 1e+10f;

			// Refine left/right children locations using k-means iterations
			const uint32_t cMaxIters = 6;
			for (uint32_t iter = 0; iter < cMaxIters; iter++)
			{
				l_children.resize(0); 
				r_children.resize(0); 

				TrainingVectorType new_l_child(cZero), new_r_child(cZero);

				double l_ttsum = 0.0f, r_ttsum = 0.0f;

				l_weight = 0;
				r_weight = 0;

				for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
				{
					const TrainingVectorType &v = m_training_vecs[node.m_training_vecs[i]].first;
					const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;

					double left_dist2 = l_child.squared_distance_d(v), right_dist2 = r_child.squared_distance_d(v);

					if (left_dist2 >= right_dist2)
					{
						new_r_child += (v * static_cast<float>(weight));
						r_weight += weight;

						r_ttsum += weight * v.dot(v);
						r_children.push_back(node.m_training_vecs[i]);
					}
					else
					{
						new_l_child += (v * static_cast<float>(weight));
						l_weight += weight;

						l_ttsum += weight * v.dot(v);
						l_children.push_back(node.m_training_vecs[i]);
					}
				}

				// Node is unsplittable using the above algorithm - try something else to split it up.
				if ((!l_weight) || (!r_weight))
				{
					l_children.resize(0);
					new_l_child.set(0.0f);
					l_ttsum = 0.0f;
					l_weight = 0;

					r_children.resize(0);
					new_r_child.set(0.0f);
					r_ttsum = 0.0f;
					r_weight = 0;

					TrainingVectorType firstVec;
					for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
					{
						const TrainingVectorType& v = m_training_vecs[node.m_training_vecs[i]].first;
						const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;
					
						if ((!i) || (v == firstVec))
						{
							firstVec = v;

							new_r_child += (v * static_cast<float>(weight));
							r_weight += weight;

							r_ttsum += weight * v.dot(v);
							r_children.push_back(node.m_training_vecs[i]);
						}
						else
						{
							new_l_child += (v * static_cast<float>(weight));
							l_weight += weight;

							l_ttsum += weight * v.dot(v);
							l_children.push_back(node.m_training_vecs[i]);
						}
					}

					if ((!l_weight) || (!r_weight))
						return false;
				}

				l_var = static_cast<float>(l_ttsum - (new_l_child.dot(new_l_child) / l_weight));
				r_var = static_cast<float>(r_ttsum - (new_r_child.dot(new_r_child) / r_weight));

				new_l_child *= (1.0f / l_weight);
				new_r_child *= (1.0f / r_weight);

				l_child = new_l_child;
				r_child = new_r_child;

				float total_var = l_var + r_var;
				const float cGiveupVariance = .00001f;
				if (total_var < cGiveupVariance)
					break;

				// Check to see if the variance has settled
				const float cVarianceDeltaThresh = .00125f;
				if (((prev_total_variance - total_var) / total_var) < cVarianceDeltaThresh)
					break;

				prev_total_variance = total_var;
			}

			return true;
		}